

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmp.c
# Opt level: O3

void pmpcfg_csr_write_riscv32
               (CPURISCVState_conflict *env,uint32_t reg_index,target_ulong_conflict val)

{
  long lVar1;
  byte bVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(reg_index * 4);
  bVar2 = 0;
  lVar1 = 0;
  do {
    if (((uVar3 + lVar1 < 0x10) && (-1 < (char)(env->pmp_state).pmp[uVar3 + lVar1].cfg_reg)) &&
       ((uVar3 + lVar1 == 0xf || (((env->pmp_state).pmp[uVar3 + lVar1 + 1].cfg_reg & 0x98) != 0x88))
       )) {
      (env->pmp_state).pmp[uVar3 + lVar1].cfg_reg = (uint8_t)(val >> (bVar2 & 0x1f));
      pmp_update_rule(env,reg_index * 4 + (int)lVar1);
    }
    lVar1 = lVar1 + 1;
    bVar2 = bVar2 + 8;
  } while (lVar1 != 4);
  return;
}

Assistant:

void pmpcfg_csr_write(CPURISCVState *env, uint32_t reg_index,
    target_ulong val)
{
    int i;
    uint8_t cfg_val;

    if ((reg_index & 1) && (sizeof(target_ulong) == 8)) {
        qemu_log_mask(LOG_GUEST_ERROR,
                      "ignoring pmpcfg write - incorrect address\n");
        return;
    }

    for (i = 0; i < sizeof(target_ulong); i++) {
        cfg_val = (val >> 8 * i)  & 0xff;
        pmp_write_cfg(env, (reg_index * sizeof(target_ulong)) + i,
            cfg_val);
    }
}